

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::SourceInfoTest_EnumReservedName_Test::
SourceInfoTest_EnumReservedName_Test(SourceInfoTest_EnumReservedName_Test *this)

{
  SourceInfoTest_EnumReservedName_Test *this_local;
  
  SourceInfoTest::SourceInfoTest(&this->super_SourceInfoTest);
  (this->super_SourceInfoTest).super_ParserTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SourceInfoTest_EnumReservedName_Test_02a10b48;
  return;
}

Assistant:

TEST_F(SourceInfoTest, EnumReservedName) {
  EXPECT_TRUE(
      Parse("enum TestEnum {\n"
            "  $a$reserved $b$'foo'$c$;$d$\n"
            "}"));

  const EnumDescriptorProto& bar = file_.enum_type(0);

  EXPECT_TRUE(HasSpan('a', 'd', bar, "reserved_name"));
  EXPECT_TRUE(HasSpan('b', 'c', bar, "reserved_name", 0));

  // Ignore these.
  EXPECT_TRUE(HasSpan(file_));
  EXPECT_TRUE(HasSpan(file_.enum_type(0)));
  EXPECT_TRUE(HasSpan(file_.enum_type(0), "name"));
}